

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O0

float GD::InvSqrt(float x)

{
  undefined1 auVar1 [16];
  __m128 eta;
  float x_local;
  undefined4 local_18;
  
  auVar1 = rsqrtss(ZEXT416((uint)x),ZEXT416((uint)x));
  local_18 = auVar1._0_4_;
  return local_18;
}

Assistant:

static inline float InvSqrt(float x)
{
#if !defined(VW_NO_INLINE_SIMD)
#if defined(__ARM_NEON__)
  // Propagate into vector
  float32x2_t v1 = vdup_n_f32(x);
  // Estimate
  float32x2_t e1 = vrsqrte_f32(v1);
  // N-R iteration 1
  float32x2_t e2 = vmul_f32(e1, vrsqrts_f32(v1, vmul_f32(e1, e1)));
  // N-R iteration 2
  float32x2_t e3 = vmul_f32(e2, vrsqrts_f32(v1, vmul_f32(e2, e2)));
  // Extract result
  return vget_lane_f32(e3, 0);
#elif defined(__SSE2__)
  __m128 eta = _mm_load_ss(&x);
  eta = _mm_rsqrt_ss(eta);
  _mm_store_ss(&x, eta);
#else
  x = quake_InvSqrt(x);
#endif
#else
  x = quake_InvSqrt(x);
#endif

  return x;
}